

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GLES2ThreadTest::Object::modifyGL
          (Object *this,SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync> *sync,
          vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>_>_>
          *deps)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  FenceSync *pFVar4;
  int local_24;
  int readNdx;
  vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>_>_>
  *deps_local;
  SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync> *sync_local;
  Object *this_local;
  
  for (local_24 = 0;
      sVar2 = std::
              vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>_>_>
              ::size(&this->m_readSyncs), local_24 < (int)sVar2; local_24 = local_24 + 1) {
    pvVar3 = std::
             vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>_>_>
             ::operator[](&this->m_readSyncs,(long)local_24);
    bVar1 = de::SharedPtr::operator_cast_to_bool((SharedPtr *)pvVar3);
    if (bVar1) {
      pvVar3 = std::
               vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>_>_>
               ::operator[](&this->m_readSyncs,(long)local_24);
      pFVar4 = de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>::operator->(pvVar3);
      FenceSync::addWaiter(pFVar4);
    }
    pvVar3 = std::
             vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>_>_>
             ::operator[](&this->m_readSyncs,(long)local_24);
    std::
    vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>_>_>
    ::push_back(deps,pvVar3);
  }
  bVar1 = de::SharedPtr::operator_cast_to_bool((SharedPtr *)&this->m_modifySync);
  if (bVar1) {
    pFVar4 = de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>::operator->(&this->m_modifySync);
    FenceSync::addWaiter(pFVar4);
  }
  std::
  vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>_>_>
  ::push_back(deps,&this->m_modifySync);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>::operator=(&this->m_modifySync,sync);
  std::
  vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>_>_>
  ::clear(&this->m_readSyncs);
  return;
}

Assistant:

void Object::modifyGL (SharedPtr<FenceSync> sync, std::vector<SharedPtr<FenceSync> >& deps)
{
	// Make call depend on all reads
	for (int readNdx = 0; readNdx < (int)m_readSyncs.size(); readNdx++)
	{
		if (m_readSyncs[readNdx])
			m_readSyncs[readNdx]->addWaiter();

		deps.push_back(m_readSyncs[readNdx]);
	}

	if (m_modifySync)
		m_modifySync->addWaiter();

	deps.push_back(m_modifySync);

	// Update last modifying call
	m_modifySync = sync;

	// Clear read dependencies of last "version" of this object
	m_readSyncs.clear();
}